

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * nite::strRemoveSpaces(string *__return_storage_ptr__,string *Input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = std::__cxx11::string::find((char *)Input,0x247fbb,0);
  while (iVar4 != -1) {
    uVar5 = std::__cxx11::string::find((char *)Input,0x247fbb,0);
    std::__cxx11::string::erase((ulong)Input,uVar5);
    iVar4 = std::__cxx11::string::find((char *)Input,0x247fbb,0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (Input->_M_dataplus)._M_p;
  paVar1 = &Input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&Input->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = Input->_M_string_length;
  (Input->_M_dataplus)._M_p = (pointer)paVar1;
  Input->_M_string_length = 0;
  (Input->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

String nite::strRemoveSpaces(String Input){
	while ((signed)Input.find(" ")!=-1){
		Input.erase(Input.find(" "),1);
	}
	return Input;
}